

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::CheckFieldIndex(FieldDescriptor *field,int index)

{
  bool bVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_99;
  LogMessage local_98;
  LogFinisher local_5d [13];
  LogMessage local_50;
  int local_14;
  FieldDescriptor *pFStack_10;
  int index_local;
  FieldDescriptor *field_local;
  
  if (field != (FieldDescriptor *)0x0) {
    local_14 = index;
    pFStack_10 = field;
    bVar1 = FieldDescriptor::is_repeated(field);
    if ((bVar1) && (local_14 == -1)) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                 ,0x9b);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_50,"Index must be in range of repeated field values. ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,"Field: ");
      psVar3 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
      pLVar2 = internal::LogMessage::operator<<(pLVar2,psVar3);
      internal::LogFinisher::operator=(local_5d,pLVar2);
      internal::LogMessage::~LogMessage(&local_50);
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(pFStack_10);
      if ((!bVar1) && (local_14 != -1)) {
        internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x9e);
        pLVar2 = internal::LogMessage::operator<<(&local_98,"Index must be -1 for singular fields.")
        ;
        pLVar2 = internal::LogMessage::operator<<(pLVar2,"Field: ");
        psVar3 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,psVar3);
        internal::LogFinisher::operator=(&local_99,pLVar2);
        internal::LogMessage::~LogMessage(&local_98);
      }
    }
  }
  return;
}

Assistant:

void CheckFieldIndex(const FieldDescriptor* field, int index) {
  if (field == NULL) { return; }

  if (field->is_repeated() && index == -1) {
    GOOGLE_LOG(DFATAL) << "Index must be in range of repeated field values. "
                << "Field: " << field->name();
  } else if (!field->is_repeated() && index != -1) {
    GOOGLE_LOG(DFATAL) << "Index must be -1 for singular fields."
                << "Field: " << field->name();
  }
}